

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O0

void __thiscall
OpenMD::HBondRvol::HBondRvol
          (HBondRvol *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          double rCut,RealType len,double thetaCut,int nrbins)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  ForceField *pFVar4;
  string *in_RCX;
  undefined8 *in_RDI;
  string *in_R8;
  string *in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined4 in_stack_00000008;
  SimInfo *in_stack_000000d8;
  SelectionManager *in_stack_000000e0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  string *psVar5;
  string *in_stack_fffffffffffffe30;
  StaticAnalyser *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  SelectionEvaluator *this_01;
  SelectionEvaluator *this_02;
  string local_110 [32];
  string local_f0 [24];
  SimInfo *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (SimInfo *)in_stack_fffffffffffffe38._M_current,in_stack_fffffffffffffe30,
             (uint)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  *in_RDI = &PTR__HBondRvol_0055f438;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),in_RCX);
  SelectionManager::SelectionManager(in_stack_000000e0,in_stack_000000d8);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  std::__cxx11::string::string((string *)(in_RDI + 0xe1),in_R8);
  SelectionManager::SelectionManager(in_stack_000000e0,in_stack_000000d8);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  std::__cxx11::string::string((string *)(in_RDI + 0x1a8),in_R9);
  SelectionManager::SelectionManager(in_stack_000000e0,in_stack_000000d8);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  in_RDI[0x270] = in_XMM1_Qa;
  *(undefined4 *)((long)in_RDI + 0x13a4) = in_stack_00000008;
  this_01 = (SelectionEvaluator *)(in_RDI + 0x275);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x16f2b9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f2d2);
  psVar5 = (string *)(in_RDI + 0x27b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f2eb);
  this_02 = (SelectionEvaluator *)(in_RDI + 0x27e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f304);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f31d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f336);
  pFVar4 = SimInfo::getForceField((SimInfo *)in_RDI[1]);
  in_RDI[0x26f] = pFVar4;
  SelectionEvaluator::loadScriptString(this_02,psVar5);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
  if (!bVar1) {
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (SelectionSet *)in_stack_fffffffffffffe38._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x16f3ed);
  }
  SelectionEvaluator::loadScriptString(this_02,psVar5);
  uVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xfe));
  if (!(bool)uVar2) {
    in_stack_fffffffffffffe48 = in_RDI + 0xe5;
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (SelectionSet *)in_stack_fffffffffffffe38._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x16f5a1);
  }
  SelectionEvaluator::loadScriptString(this_02,psVar5);
  uVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1c5));
  if (!(bool)uVar3) {
    in_stack_fffffffffffffe38._M_current = (double *)(in_RDI + 0x1ac);
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar3,in_stack_fffffffffffffe40),
               (SelectionSet *)in_stack_fffffffffffffe38._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x16f658);
  }
  in_RDI[0x271] = in_XMM0_Qa;
  in_RDI[0x273] = in_XMM2_Qa;
  in_RDI[0x272] = (double)in_RDI[0x270] / (double)*(int *)((long)in_RDI + 0x13a4);
  *(undefined4 *)((long)in_RDI + 0x13a4) = in_stack_00000008;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48);
  this_00 = (StaticAnalyser *)(in_RDI + 0x275);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
  __first._M_current._7_1_ = uVar3;
  __first._M_current._0_7_ = in_stack_fffffffffffffe40;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (__first,in_stack_fffffffffffffe38,(double *)this_00);
  psVar5 = (string *)(in_RDI + 0x278);
  std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)psVar5);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)psVar5);
  __first_00._M_current._7_1_ = uVar3;
  __first_00._M_current._0_7_ = in_stack_fffffffffffffe40;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffe38._M_current,(int *)this_00);
  getPrefix((string *)in_stack_fffffffffffffe38._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe38._M_current,(char *)this_00);
  StaticAnalyser::setOutputName(this_00,psVar5);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  return;
}

Assistant:

HBondRvol::HBondRvol(SimInfo* info, const std::string& filename,
                       const std::string& sele1, const std::string& sele2,
                       const std::string& sele3, double rCut, RealType len,
                       double thetaCut, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript1_(sele1), seleMan1_(info), evaluator1_(info),
      selectionScript2_(sele2), seleMan2_(info), evaluator2_(info),
      selectionScript3_(sele3), seleMan3_(info), evaluator3_(info), len_(len),
      nBins_(nrbins) {
    ff_ = info_->getForceField();

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    // Set up cutoff values:

    rCut_     = rCut;
    thetaCut_ = thetaCut;
    deltaR_   = len_ / nBins_;
    nBins_    = nrbins;

    // fixed number of bins

    nHBonds_.resize(nBins_);
    nDonor_.resize(nBins_);
    nAcceptor_.resize(nBins_);
    sliceQ_.resize(nBins_);
    binvol_.resize(nBins_);
    sliceCount_.resize(nBins_);
    std::fill(sliceQ_.begin(), sliceQ_.end(), 0.0);
    std::fill(sliceCount_.begin(), sliceCount_.end(), 0);

    setOutputName(getPrefix(filename) + ".hbondrvol");
  }